

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
          (VulkanCommandBuffer *this,VkImage Image,VkImageLayout OldLayout,VkImageLayout NewLayout,
          VkImageSubresourceRange *SubresRange,VkPipelineStageFlags SrcStages,
          VkPipelineStageFlags DstStages)

{
  VkPipelineStageFlags *pVVar1;
  VkAccessFlags *pVVar2;
  pointer *ppVVar3;
  uint Max1;
  uint Min1;
  uint Min0;
  uint Min1_00;
  bool bVar4;
  bool bVar5;
  VkAccessFlags VVar6;
  pointer pVVar7;
  int iVar8;
  uint Max1_00;
  undefined4 in_register_0000000c;
  char (*Args_1) [49];
  long lVar9;
  uint Max0;
  uint Max0_00;
  undefined8 *puVar10;
  iterator __position;
  ulong uVar11;
  byte bVar12;
  VkImageMemoryBarrier ImgBarrier;
  undefined1 local_98 [20];
  uint uStack_84;
  VkImageLayout VStack_80;
  VkImageLayout VStack_7c;
  undefined8 local_78;
  VkImage pVStack_70;
  undefined1 local_68 [32];
  VkImage local_48;
  VulkanCommandBuffer *local_40;
  VkImageSubresourceRange *local_38;
  
  Args_1 = (char (*) [49])CONCAT44(in_register_0000000c,NewLayout);
  bVar12 = 0;
  local_38 = SubresRange;
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  if (((this->m_Barrier).SupportedStagesMask & SrcStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)local_98,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcStages & m_Barrier.SupportedStagesMask) != 0",Args_1);
    Args_1 = (char (*) [49])0xa2;
    Diligent::DebugAssertionFailed
              ((Char *)local_98._0_8_,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa2);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,stack0xffffffffffffff78 + 1);
    }
  }
  if (((this->m_Barrier).SupportedStagesMask & DstStages) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)local_98,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(DstStages & m_Barrier.SupportedStagesMask) != 0",Args_1);
    Diligent::DebugAssertionFailed
              ((Char *)local_98._0_8_,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa3);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,stack0xffffffffffffff78 + 1);
    }
  }
  if (OldLayout == NewLayout) {
    (this->m_Barrier).MemorySrcStages = (this->m_Barrier).MemorySrcStages | SrcStages;
    pVVar1 = &(this->m_Barrier).MemoryDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    VVar6 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    pVVar2 = &(this->m_Barrier).MemorySrcAccess;
    *pVVar2 = *pVVar2 | VVar6;
    VVar6 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    pVVar2 = &(this->m_Barrier).MemoryDstAccess;
    *pVVar2 = *pVVar2 | VVar6;
  }
  else {
    pVVar7 = (this->m_ImageBarriers).
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->m_ImageBarriers).
        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar7) {
      lVar9 = 0x40;
      uVar11 = 0;
      local_48 = Image;
      local_40 = this;
      do {
        iVar8 = 0xc;
        if (*(VkImage *)((long)pVVar7 + lVar9 + -0x18) == Image) {
          Max0_00 = local_38->layerCount + local_38->baseArrayLayer;
          if (local_38->layerCount == 0xffffffff) {
            Max0_00 = 0xffffffff;
          }
          Min1 = *(uint *)((long)pVVar7 + lVar9 + -4);
          iVar8 = *(int *)((long)&pVVar7->sType + lVar9);
          Max1_00 = iVar8 + Min1;
          if (iVar8 == -1) {
            Max1_00 = 0xffffffff;
          }
          Min0 = local_38->baseMipLevel;
          Max0 = local_38->levelCount + Min0;
          if (local_38->levelCount == 0xffffffff) {
            Max0 = 0xffffffff;
          }
          Min1_00 = *(uint *)((long)pVVar7 + lVar9 + -0xc);
          iVar8 = *(int *)((long)pVVar7 + lVar9 + -8);
          Max1 = iVar8 + Min1_00;
          if (iVar8 == -1) {
            Max1 = 0xffffffff;
          }
          bVar4 = Diligent::CheckLineSectionOverlap<true,unsigned_int>
                            (local_38->baseArrayLayer,Max0_00,Min1,Max1_00);
          bVar5 = Diligent::CheckLineSectionOverlap<true,unsigned_int>(Min0,Max0,Min1_00,Max1);
          this = local_40;
          Image = local_48;
          iVar8 = 0;
          if ((bVar4) && (bVar5)) {
            FlushBarriers(local_40);
            iVar8 = 10;
          }
        }
        if ((iVar8 != 0xc) && (iVar8 != 0)) break;
        uVar11 = uVar11 + 1;
        pVVar7 = (this->m_ImageBarriers).
                 super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x48;
      } while (uVar11 < (ulong)(((long)(this->m_ImageBarriers).
                                       super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >>
                                3) * -0x71c71c71c71c71c7));
    }
    pVVar1 = &(this->m_Barrier).ImageSrcStages;
    *pVVar1 = *pVVar1 | SrcStages;
    pVVar1 = &(this->m_Barrier).ImageDstStages;
    *pVVar1 = *pVVar1 | DstStages;
    stack0xffffffffffffff78 = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_98._0_8_ = (pointer)0x2d;
    local_98._8_8_ = (void *)0x0;
    VStack_7c = NewLayout;
    VStack_80 = OldLayout;
    local_68._0_4_ = local_38->aspectMask;
    local_68._4_4_ = local_38->baseMipLevel;
    local_68._8_4_ = local_38->levelCount;
    local_68._12_4_ = local_38->baseArrayLayer;
    local_68._20_4_ = 0;
    local_68._16_4_ = local_38->layerCount;
    pVStack_70 = Image;
    VVar6 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    local_98._16_4_ = VVar6 & (this->m_Barrier).SupportedAccessMask;
    VVar6 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    uStack_84 = VVar6 & (this->m_Barrier).SupportedAccessMask;
    local_78._0_4_ = 0xffffffff;
    local_78._4_4_ = 0xffffffff;
    __position._M_current =
         (this->m_ImageBarriers).
         super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_ImageBarriers).
        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>>::
      _M_realloc_insert<VkImageMemoryBarrier&>
                ((vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>> *)
                 &this->m_ImageBarriers,__position,(VkImageMemoryBarrier *)local_98);
    }
    else {
      puVar10 = (undefined8 *)local_98;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)__position._M_current = *puVar10;
        puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
        __position._M_current = __position._M_current + (ulong)bVar12 * -0x10 + 8;
      }
      ppVVar3 = &(this->m_ImageBarriers).
                 super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar3 = *ppVVar3 + 1;
    }
  }
  return;
}

Assistant:

void VulkanCommandBuffer::TransitionImageLayout(VkImage                        Image,
                                                VkImageLayout                  OldLayout,
                                                VkImageLayout                  NewLayout,
                                                const VkImageSubresourceRange& SubresRange,
                                                VkPipelineStageFlags           SrcStages,
                                                VkPipelineStageFlags           DstStages)
{
    // Image layout transitions within a render pass execute
    // dependencies between attachments
    EndRenderScope();

    VERIFY_EXPR((SrcStages & m_Barrier.SupportedStagesMask) != 0);
    VERIFY_EXPR((DstStages & m_Barrier.SupportedStagesMask) != 0);

    if (OldLayout == NewLayout)
    {
        m_Barrier.MemorySrcStages |= SrcStages;
        m_Barrier.MemoryDstStages |= DstStages;

        m_Barrier.MemorySrcAccess |= AccessMaskFromImageLayout(OldLayout, false);
        m_Barrier.MemoryDstAccess |= AccessMaskFromImageLayout(NewLayout, true);
        return;
    }

    // Check overlapping subresources
    for (size_t i = 0; i < m_ImageBarriers.size(); ++i)
    {
        const auto& ImgBarrier = m_ImageBarriers[i];
        if (ImgBarrier.image != Image)
            continue;

        const auto& OtherRange = ImgBarrier.subresourceRange;

        const auto StartLayer0 = SubresRange.baseArrayLayer;
        const auto EndLayer0   = SubresRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (SubresRange.baseArrayLayer + SubresRange.layerCount) : ~0u;
        const auto StartLayer1 = OtherRange.baseArrayLayer;
        const auto EndLayer1   = OtherRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (OtherRange.baseArrayLayer + OtherRange.layerCount) : ~0u;

        const auto StartMip0 = SubresRange.baseMipLevel;
        const auto EndMip0   = SubresRange.levelCount != VK_REMAINING_MIP_LEVELS ? (SubresRange.baseMipLevel + SubresRange.levelCount) : ~0u;
        const auto StartMip1 = OtherRange.baseMipLevel;
        const auto EndMip1   = OtherRange.levelCount != VK_REMAINING_MIP_LEVELS ? (OtherRange.baseMipLevel + OtherRange.levelCount) : ~0u;

        const auto SlicesOverlap = Diligent::CheckLineSectionOverlap<true>(StartLayer0, EndLayer0, StartLayer1, EndLayer1);
        const auto MipsOverlap   = Diligent::CheckLineSectionOverlap<true>(StartMip0, EndMip0, StartMip1, EndMip1);

        // If the range overlaps with any of the existing barriers, we need to
        // flush them.
        if (SlicesOverlap && MipsOverlap)
        {
            FlushBarriers();
            break;
        }
    }

    m_Barrier.ImageSrcStages |= SrcStages;
    m_Barrier.ImageDstStages |= DstStages;

    VkImageMemoryBarrier ImgBarrier{};
    ImgBarrier.sType               = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    ImgBarrier.pNext               = nullptr;
    ImgBarrier.oldLayout           = OldLayout;
    ImgBarrier.newLayout           = NewLayout;
    ImgBarrier.image               = Image;
    ImgBarrier.subresourceRange    = SubresRange;
    ImgBarrier.srcAccessMask       = AccessMaskFromImageLayout(OldLayout, false) & m_Barrier.SupportedAccessMask;
    ImgBarrier.dstAccessMask       = AccessMaskFromImageLayout(NewLayout, true) & m_Barrier.SupportedAccessMask;
    ImgBarrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // source queue family for a queue family ownership transfer.
    ImgBarrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // destination queue family for a queue family ownership transfer.
    m_ImageBarriers.emplace_back(ImgBarrier);
}